

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_keyset<int>
          (DoubleArrayBuilder *this,Keyset<int> *keyset,size_t begin,size_t end,size_t depth,
          id_type dic_id)

{
  ulong uVar1;
  uchar_type uVar2;
  id_type iVar3;
  Keyset<int> *in_RCX;
  Keyset<int> *in_RDX;
  DoubleArrayBuilder *in_RSI;
  size_t in_RDI;
  size_t in_R8;
  undefined4 in_R9D;
  uchar_type label;
  uchar_type last_label;
  size_t last_begin;
  id_type offset;
  id_type in_stack_0000004c;
  size_t in_stack_00000050;
  size_t in_stack_00000058;
  size_t in_stack_00000060;
  Keyset<int> *in_stack_00000068;
  DoubleArrayBuilder *in_stack_00000070;
  undefined6 in_stack_ffffffffffffffc0;
  uchar_type in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  Keyset<int> *in_stack_ffffffffffffffc8;
  Keyset<int> *keyset_00;
  
  iVar3 = arrange_from_keyset<int>
                    (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                     in_stack_00000050,in_stack_0000004c);
  while ((in_RDX < in_RCX &&
         (uVar2 = Keyset<int>::keys(in_stack_ffffffffffffffc8,
                                    CONCAT17(in_stack_ffffffffffffffc7,
                                             CONCAT16(in_stack_ffffffffffffffc6,
                                                      in_stack_ffffffffffffffc0)),in_RDI),
         uVar2 == '\0'))) {
    in_RDX = (Keyset<int> *)((long)&in_RDX->num_keys_ + 1);
  }
  if (in_RDX != in_RCX) {
    keyset_00 = in_RDX;
    uVar2 = Keyset<int>::keys(in_RDX,CONCAT17(in_stack_ffffffffffffffc7,
                                              CONCAT16(in_stack_ffffffffffffffc6,
                                                       in_stack_ffffffffffffffc0)),in_RDI);
    while (keyset_00 = (Keyset<int> *)((long)&keyset_00->num_keys_ + 1), keyset_00 < in_RCX) {
      in_stack_ffffffffffffffc6 =
           Keyset<int>::keys(in_RDX,CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,
                                                            in_stack_ffffffffffffffc0)),in_RDI);
      if (in_stack_ffffffffffffffc6 != uVar2) {
        uVar1 = (ulong)in_RDX >> 0x20;
        in_RDX = keyset_00;
        build_from_keyset<int>
                  (in_RSI,keyset_00,(size_t)in_RCX,in_R8,CONCAT44(in_R9D,iVar3),(id_type)uVar1);
        keyset_00 = in_RDX;
        uVar2 = Keyset<int>::keys(in_RDX,CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,
                                                                 in_stack_ffffffffffffffc0)),in_RDI)
        ;
      }
    }
    build_from_keyset<int>
              (in_RSI,keyset_00,(size_t)in_RCX,in_R8,CONCAT44(in_R9D,iVar3),
               (id_type)((ulong)in_RDX >> 0x20));
  }
  return;
}

Assistant:

void DoubleArrayBuilder::build_from_keyset(const Keyset<T> &keyset,
    std::size_t begin, std::size_t end, std::size_t depth, id_type dic_id) {
  id_type offset = arrange_from_keyset(keyset, begin, end, depth, dic_id);

  while (begin < end) {
    if (keyset.keys(begin, depth) != '\0') {
      break;
    }
    ++begin;
  }
  if (begin == end) {
    return;
  }

  std::size_t last_begin = begin;
  uchar_type last_label = keyset.keys(begin, depth);
  while (++begin < end) {
    uchar_type label = keyset.keys(begin, depth);
    if (label != last_label) {
      build_from_keyset(keyset, last_begin, begin,
          depth + 1, offset ^ last_label);
      last_begin = begin;
      last_label = keyset.keys(begin, depth);
    }
  }
  build_from_keyset(keyset, last_begin, end, depth + 1, offset ^ last_label);
}